

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpf_test.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_514ce4::Loop8Test6Param_hbd_ValueCheck_Test::TestBody
          (Loop8Test6Param_hbd_ValueCheck_Test *this)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  byte bVar4;
  undefined8 *puVar5;
  ushort uVar6;
  uint32_t uVar7;
  uint uVar8;
  int iVar9;
  SEARCH_METHODS *message;
  int j;
  long lVar10;
  undefined2 in_FPUControlWord;
  uint16_t in_FPUTagWord;
  undefined8 in_FPUInstructionPointer;
  int iVar11;
  undefined1 uVar15;
  undefined1 uVar16;
  undefined1 uVar17;
  int iVar18;
  int iVar19;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  int iVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar25 [16];
  int err_count_total;
  RegisterStateCheckMMX reg_check_mmx;
  ACMRandom rnd;
  uint16_t ref_s [1024];
  uint16_t s [1024];
  int local_10ac;
  Message local_10a8;
  undefined4 uStack_10a0;
  undefined4 uStack_109c;
  int local_108c;
  AssertHelper local_1088;
  undefined4 uStack_1080;
  undefined4 uStack_107c;
  unsigned_short *local_1078;
  unsigned_short *local_1070;
  RegisterStateCheckMMX local_1068;
  Random local_104c;
  undefined4 local_1048;
  undefined4 uStack_1044;
  undefined4 uStack_1040;
  undefined4 uStack_103c;
  ushort local_1038 [264];
  unsigned_short auStack_e28 [760];
  ushort local_838 [264];
  unsigned_short auStack_628 [764];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  
  local_104c.state_ = 0xbaba;
  local_10ac = 0;
  local_1070 = auStack_e28;
  local_1078 = auStack_628;
  iVar11 = -1;
  iVar9 = 0;
  do {
    local_108c = iVar11;
    uVar7 = testing::internal::Random::Generate(&local_104c,0xc2);
    uVar17 = (undefined1)(uVar7 >> 0x18);
    uVar16 = (undefined1)(uVar7 >> 0x10);
    uVar15 = (undefined1)(uVar7 >> 8);
    auVar12._4_4_ =
         (int)(CONCAT35(CONCAT21(CONCAT11(uVar17,uVar17),uVar16),CONCAT14(uVar16,uVar7)) >> 0x20);
    auVar12[3] = uVar15;
    auVar12[2] = uVar15;
    auVar12[0] = (undefined1)uVar7;
    auVar12[1] = auVar12[0];
    auVar12._8_8_ = 0;
    auVar12 = pshuflw(auVar12,auVar12,0);
    local_10a8.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_4_ = auVar12._0_4_;
    local_10a8.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_4_ =
         local_10a8.ss_._M_t.
         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         ._M_head_impl._0_4_;
    uStack_10a0 = local_10a8.ss_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl._0_4_;
    uStack_109c = local_10a8.ss_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl._0_4_;
    uVar7 = testing::internal::Random::Generate(&local_104c,0x40);
    uVar17 = (undefined1)(uVar7 >> 0x18);
    uVar16 = (undefined1)(uVar7 >> 0x10);
    uVar15 = (undefined1)(uVar7 >> 8);
    auVar13._4_4_ =
         (int)(CONCAT35(CONCAT21(CONCAT11(uVar17,uVar17),uVar16),CONCAT14(uVar16,uVar7)) >> 0x20);
    auVar13[3] = uVar15;
    auVar13[2] = uVar15;
    auVar13[0] = (undefined1)uVar7;
    auVar13[1] = auVar13[0];
    auVar13._8_8_ = 0;
    auVar12 = pshuflw(auVar13,auVar13,0);
    local_1088.data_._0_4_ = auVar12._0_4_;
    local_1088.data_._4_4_ = local_1088.data_._0_4_;
    uStack_1080 = local_1088.data_._0_4_;
    uStack_107c = local_1088.data_._0_4_;
    uVar7 = testing::internal::Random::Generate(&local_104c,0x40);
    uVar8 = uVar7 >> 4;
    bVar4 = (byte)(uVar7 >> 0x18);
    uVar16 = (undefined1)(uVar8 >> 0x10);
    uVar15 = (undefined1)(uVar8 >> 8);
    auVar14._4_4_ =
         (int)(CONCAT35(CONCAT21(CONCAT11(bVar4 >> 4,bVar4 >> 4),uVar16),CONCAT14(uVar16,uVar8)) >>
              0x20);
    auVar14[3] = uVar15;
    auVar14[2] = uVar15;
    auVar14[0] = (undefined1)uVar8;
    auVar14[1] = auVar14[0];
    auVar14._8_8_ = 0;
    auVar12 = pshuflw(auVar14,auVar14,0);
    local_1048 = auVar12._0_4_;
    lVar10 = 0;
    uStack_1044 = local_1048;
    uStack_1040 = local_1048;
    uStack_103c = local_1048;
    do {
      uVar7 = testing::internal::Random::Generate(&local_104c,0x80000000);
      uVar6 = (ushort)(uVar7 >> 0xf) & (ushort)(this->super_Loop8Test6Param_hbd).mask_;
      local_838[lVar10] = uVar6;
      local_1038[lVar10] = uVar6;
      lVar10 = lVar10 + 1;
    } while (lVar10 != 0x400);
    (*(this->super_Loop8Test6Param_hbd).ref_loopfilter_op_)
              (local_1070,0x20,(uchar *)&local_10a8,(uchar *)&local_1088,(uchar *)&local_1048,
               (this->super_Loop8Test6Param_hbd).bit_depth_);
    local_1068.pre_fpu_env_[0]._0_1_ = SUB21(in_FPUControlWord,0);
    local_1068.pre_fpu_env_._12_4_ = SUB84(in_FPUInstructionPointer,0);
    local_1068.pre_fpu_env_[8] = (uint16_t)((ulong)in_FPUInstructionPointer >> 0x20);
    local_1068.pre_fpu_env_[4] = in_FPUTagWord;
    (*(this->super_Loop8Test6Param_hbd).loopfilter_op_)
              (local_1078,0x20,(uchar *)&local_10a8,(uchar *)&local_1088,(uchar *)&local_1048,
               (this->super_Loop8Test6Param_hbd).bit_depth_);
    libaom_test::RegisterStateCheckMMX::Check(&local_1068);
    iVar11 = 0;
    iVar18 = 0;
    iVar19 = 0;
    iVar20 = 0;
    lVar10 = 0;
    do {
      uVar1 = *(undefined8 *)(local_1038 + lVar10);
      uVar2 = *(undefined8 *)(local_838 + lVar10);
      auVar21._0_2_ = -(ushort)((short)uVar2 == (short)uVar1);
      auVar21._2_2_ = -(ushort)((short)((ulong)uVar2 >> 0x10) == (short)((ulong)uVar1 >> 0x10));
      auVar21._4_2_ = -(ushort)((short)((ulong)uVar2 >> 0x20) == (short)((ulong)uVar1 >> 0x20));
      auVar21._6_2_ = -(ushort)((short)((ulong)uVar2 >> 0x30) == (short)((ulong)uVar1 >> 0x30));
      auVar21._8_2_ = 0xffff;
      auVar21._10_2_ = 0xffff;
      auVar21._12_2_ = 0xffff;
      auVar21._14_2_ = 0xffff;
      auVar3._8_4_ = 0xffffffff;
      auVar3._0_8_ = 0xffffffffffffffff;
      auVar3._12_4_ = 0xffffffff;
      auVar21 = auVar21 ^ auVar3;
      auVar24._0_12_ = auVar21._0_12_;
      auVar24._12_2_ = auVar21._6_2_;
      auVar24._14_2_ = auVar21._6_2_;
      auVar23._12_4_ = auVar24._12_4_;
      auVar23._0_10_ = auVar21._0_10_;
      auVar23._10_2_ = auVar21._4_2_;
      auVar22._10_6_ = auVar23._10_6_;
      auVar22._0_8_ = auVar21._0_8_;
      auVar22._8_2_ = auVar21._4_2_;
      auVar25._8_8_ = auVar22._8_8_;
      auVar25._6_2_ = auVar21._2_2_;
      auVar25._4_2_ = auVar21._2_2_;
      auVar25._0_2_ = auVar21._0_2_;
      auVar25._2_2_ = auVar25._0_2_;
      auVar25 = auVar25 & _DAT_00c39da0;
      iVar11 = iVar11 + auVar25._0_4_;
      iVar18 = iVar18 + auVar25._4_4_;
      iVar19 = iVar19 + auVar25._8_4_;
      iVar20 = iVar20 + auVar25._12_4_;
      lVar10 = lVar10 + 4;
    } while (lVar10 != 0x400);
    iVar19 = iVar20 + iVar18 + iVar19 + iVar11;
    iVar18 = iVar9;
    if (local_10ac != 0) {
      iVar18 = local_108c;
    }
    iVar11 = local_108c;
    if (iVar19 != 0) {
      iVar11 = iVar18;
    }
    local_10ac = local_10ac + iVar19;
    iVar9 = iVar9 + 1;
  } while (iVar9 != 10000);
  local_10a8.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = 0;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_1068,"0","err_count_total",(int *)&local_10a8,&local_10ac);
  if (local_1068.pre_fpu_env_[0]._0_1_ == (internal)0x0) {
    testing::Message::Message(&local_10a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)
               (CONCAT44(local_10a8.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._4_4_,
                         local_10a8.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_4_) + 0x10),
               "Error: Loop8Test6Param, C output doesn\'t match SIMD loopfilter output. ",0x47);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)
               (CONCAT44(local_10a8.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._4_4_,
                         local_10a8.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_4_) + 0x10),"First failed at test case ",0x1a);
    std::ostream::operator<<
              ((void *)(CONCAT44(local_10a8.ss_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl._4_4_,
                                 local_10a8.ss_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl._0_4_) + 0x10),iVar11);
    puVar5 = (undefined8 *)
             CONCAT44(local_1068.pre_fpu_env_._12_4_,
                      CONCAT22(local_1068.pre_fpu_env_[5],local_1068.pre_fpu_env_[4]));
    if (puVar5 == (undefined8 *)0x0) {
      message = "";
    }
    else {
      message = (SEARCH_METHODS *)*puVar5;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1088,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/lpf_test.cc"
               ,0x112,(char *)message);
    testing::internal::AssertHelper::operator=(&local_1088,&local_10a8);
    testing::internal::AssertHelper::~AssertHelper(&local_1088);
    if ((long *)CONCAT44(local_10a8.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._4_4_,
                         local_10a8.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_10a8.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._4_4_,
                                     local_10a8.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._0_4_) + 8))();
    }
  }
  puVar5 = (undefined8 *)
           CONCAT44(local_1068.pre_fpu_env_._12_4_,
                    CONCAT22(local_1068.pre_fpu_env_[5],local_1068.pre_fpu_env_[4]));
  if (puVar5 != (undefined8 *)0x0) {
    if ((undefined8 *)*puVar5 != puVar5 + 2) {
      operator_delete((undefined8 *)*puVar5);
    }
    operator_delete(puVar5);
  }
  return;
}

Assistant:

TEST_P(Loop8Test6Param_hbd, ValueCheck) { VALCHECK(uint16_t, 16); }